

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

void __thiscall
QAccessibleTextWidget::selection
          (QAccessibleTextWidget *this,int selectionIndex,int *startOffset,int *endOffset)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *endOffset = 0;
  *startOffset = 0;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))();
  if (selectionIndex == 0) {
    cVar1 = QTextCursor::hasSelection();
    if (cVar1 != '\0') {
      iVar2 = QTextCursor::selectionStart();
      *startOffset = iVar2;
      iVar2 = QTextCursor::selectionEnd();
      *endOffset = iVar2;
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleTextWidget::selection(int selectionIndex, int *startOffset, int *endOffset) const
{
    *startOffset = *endOffset = 0;
    QTextCursor cursor = textCursor();

    if (selectionIndex != 0 || !cursor.hasSelection())
        return;

    *startOffset = cursor.selectionStart();
    *endOffset = cursor.selectionEnd();
}